

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHash.h
# Opt level: O2

int Hash_Int2ManInsert(Hash_IntMan_t *p,int iData0,int iData1,int iData2)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  Hash_IntObj_t *pHVar3;
  int *piVar4;
  int Fill;
  
  p_00 = p->vTable;
  iVar1 = p->vObjs->nSize / 4;
  iVar2 = p_00->nSize;
  if (iVar2 < iVar1) {
    iVar2 = Abc_PrimeCudd(iVar2 * 2);
    Vec_IntFill(p_00,iVar2,Fill);
    for (iVar2 = 1; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      pHVar3 = Hash_IntObj(p,iVar2);
      pHVar3->iNext = 0;
      piVar4 = Hash_Int2ManLookup(p,pHVar3->iData0,pHVar3->iData1);
      if (*piVar4 != 0) {
        __assert_fail("*pPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHash.h"
                      ,0xac,"int Hash_Int2ManInsert(Hash_IntMan_t *, int, int, int)");
      }
      *piVar4 = iVar2;
    }
  }
  piVar4 = Hash_Int2ManLookup(p,iData0,iData1);
  iVar2 = *piVar4;
  if (*piVar4 == 0) {
    *piVar4 = iVar1;
    Vec_IntPush(p->vObjs,iData0);
    Vec_IntPush(p->vObjs,iData1);
    Vec_IntPush(p->vObjs,0);
    Vec_IntPush(p->vObjs,0);
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

static inline int Hash_Int2ManInsert( Hash_IntMan_t * p, int iData0, int iData1, int iData2 )
{
    Hash_IntObj_t * pObj;
    int i, nObjs, * pPlace;
    nObjs = Vec_IntSize(p->vObjs)/4;
    if ( nObjs > Vec_IntSize(p->vTable) )
    {
//        printf( "Resizing...\n" );
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), 0 );
        for ( i = 1; i < nObjs; i++ )
        {
            pObj = Hash_IntObj( p, i );
            pObj->iNext = 0;
            pPlace = Hash_Int2ManLookup( p, pObj->iData0, pObj->iData1 );
            assert( *pPlace == 0 );
            *pPlace = i;
        }
    }
    pPlace = Hash_Int2ManLookup( p, iData0, iData1 );
    if ( *pPlace )
        return *pPlace;
    *pPlace = nObjs;
    Vec_IntPush( p->vObjs, iData0 );
    Vec_IntPush( p->vObjs, iData1 );
    Vec_IntPush( p->vObjs, iData2 );
    Vec_IntPush( p->vObjs, 0 );
    return nObjs;
}